

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O2

void __thiscall Diligent::GLContextState::BindVAO(GLContextState *this,GLVertexArrayObj *VAO)

{
  bool bVar1;
  GLenum err;
  GLuint VAOHandle;
  string msg;
  uint local_40;
  GLuint local_3c;
  string local_38;
  
  local_3c = 0;
  bVar1 = UpdateBoundObject<GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLVAOCreateReleaseHelper>>
                    (&this->m_VAOId,VAO,&local_3c);
  if (bVar1) {
    (*__glewBindVertexArray)(local_3c);
    local_40 = glGetError();
    if (local_40 != 0) {
      LogError<false,char[18],char[17],unsigned_int>
                (false,"BindVAO",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0xb0,(char (*) [18])"Failed to set VAO",(char (*) [17])"\nGL Error Code: ",
                 &local_40);
      FormatString<char[6]>(&local_38,(char (*) [6])0x2b552e);
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"BindVAO",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0xb0);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  return;
}

Assistant:

void GLContextState::BindVAO(const GLVertexArrayObj& VAO)
{
    GLuint VAOHandle = 0;
    if (UpdateBoundObject(m_VAOId, VAO, VAOHandle))
    {
        glBindVertexArray(VAOHandle);
        DEV_CHECK_GL_ERROR("Failed to set VAO");
    }
}